

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall CaDiCaL::Solver::trace_proof(Solver *this,char *path)

{
  File *file;
  size_t __n;
  char *__ptr;
  size_t sStack_20;
  
  if ((this->internal != (Internal *)0x0) && (this->trace_api_file != (FILE *)0x0)) {
    trace_api_call(this,"trace_proof",path);
  }
  require_solver_pointer_to_be_non_zero
            (this,"bool CaDiCaL::Solver::trace_proof(const char *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
            );
  if (this->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::trace_proof(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "external solver not initialized";
LAB_00683be1:
    sStack_20 = 0x1f;
  }
  else {
    if (this->internal == (Internal *)0x0) {
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
              "bool CaDiCaL::Solver::trace_proof(const char *)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      __ptr = "internal solver not initialized";
      goto LAB_00683be1;
    }
    if ((this->_state & VALID) != 0) {
      if (this->_state == CONFIGURING) {
        file = (File *)File::write((int)this->internal,path,__n);
        Internal::trace(this->internal,file);
        return file != (File *)0x0;
      }
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
              "bool CaDiCaL::Solver::trace_proof(const char *)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      fprintf(_stderr,"can only start proof tracing to \'%s\' right after initialization",path);
      fputc(10,_stderr);
      goto LAB_00683c82;
    }
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::trace_proof(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "solver in invalid state";
    sStack_20 = 0x17;
  }
  fwrite(__ptr,sStack_20,1,_stderr);
  fputc(10,_stderr);
LAB_00683c82:
  fflush(_stderr);
  abort();
}

Assistant:

bool Solver::trace_proof (const char *path) {
  TRACE ("trace_proof", path);
  REQUIRE_VALID_STATE ();
  REQUIRE (
      state () == CONFIGURING,
      "can only start proof tracing to '%s' right after initialization",
      path);
  File *internal_file = File::write (internal, path);
  bool res = (internal_file != 0);
  internal->trace (internal_file);
  LOG_API_CALL_RETURNS ("trace_proof", path, res);
  return res;
}